

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_loader.cpp
# Opt level: O0

ze_result_t __thiscall
loader::context_t::init_driver
          (context_t *this,driver_t *driver,ze_init_flags_t flags,ze_init_driver_type_desc_t *desc,
          ze_global_dditable_t *globalInitStored,zes_global_dditable_t *sysmanGlobalInitStored,
          bool sysmanOnly)

{
  ze_result_t result;
  code *pcVar1;
  loader local_5b8 [32];
  string local_598 [32];
  loader local_578 [32];
  string local_558 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8 [8];
  string message_2;
  ze_result_t local_4d8;
  uint32_t local_4d4;
  ze_result_t res_2;
  uint32_t pCount;
  string local_4b0 [32];
  string local_490 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470 [8];
  string errorMessage_4;
  ze_pfnInitDrivers_t pfnInitDrivers;
  string local_428 [32];
  loader local_408 [32];
  string local_3e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388 [8];
  string message_1;
  ze_result_t local_364;
  loader local_360 [4];
  ze_result_t res_1;
  string local_340 [32];
  string local_320 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300 [8];
  string errorMessage_3;
  ze_pfnInit_t pfnInit;
  string local_2b8 [32];
  loader local_298 [32];
  string local_278 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218 [8];
  string message;
  ze_result_t local_1f4;
  loader local_1f0 [4];
  ze_result_t res;
  string local_1d0 [32];
  string local_1b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190 [8];
  string errorMessage_2;
  loader local_170 [32];
  string local_150 [32];
  string local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [8];
  string errorMessage_1;
  long lStack_e8;
  ze_result_t getTableResult;
  zes_global_dditable_t global;
  string local_c0 [48];
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [8];
  string errorMessage;
  zes_pfnGetGlobalProcAddrTable_t getTable;
  bool sysmanOnly_local;
  zes_global_dditable_t *sysmanGlobalInitStored_local;
  ze_global_dditable_t *globalInitStored_local;
  ze_init_driver_type_desc_t *desc_local;
  ze_init_flags_t flags_local;
  driver_t *driver_local;
  context_t *this_local;
  
  if (sysmanOnly) {
    pcVar1 = (code *)dlsym(driver->handle,"zesGetGlobalProcAddrTable");
    if (pcVar1 == (code *)0x0) {
      if ((this->debugTraceEnabled & 1U) != 0) {
        std::operator+((char *)local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "init driver ");
        std::operator+(local_70,(char *)local_90);
        std::__cxx11::string::~string(local_90);
        std::__cxx11::string::string(local_c0,(string *)local_70);
        to_string_abi_cxx11_((loader *)&global,ZE_RESULT_ERROR_UNINITIALIZED);
        debug_trace_message(this,(string *)local_c0,(string *)&global);
        std::__cxx11::string::~string((string *)&global);
        std::__cxx11::string::~string(local_c0);
        std::__cxx11::string::~string((string *)local_70);
      }
      return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    result = (*pcVar1)(0x1000d,&stack0xffffffffffffff18);
    if (result != ZE_RESULT_SUCCESS) {
      if ((this->debugTraceEnabled & 1U) != 0) {
        std::operator+((char *)local_130,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "init driver ");
        std::operator+(local_110,(char *)local_130);
        std::__cxx11::string::~string(local_130);
        std::__cxx11::string::string(local_150,(string *)local_110);
        to_string_abi_cxx11_(local_170,result);
        debug_trace_message(this,(string *)local_150,(string *)local_170);
        std::__cxx11::string::~string((string *)local_170);
        std::__cxx11::string::~string(local_150);
        std::__cxx11::string::~string((string *)local_110);
      }
      return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    if (lStack_e8 == 0) {
      if ((this->debugTraceEnabled & 1U) != 0) {
        std::operator+((char *)local_1b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "init driver ");
        std::operator+(local_190,(char *)local_1b0);
        std::__cxx11::string::~string(local_1b0);
        std::__cxx11::string::string(local_1d0,(string *)local_190);
        to_string_abi_cxx11_(local_1f0,ZE_RESULT_ERROR_UNINITIALIZED);
        debug_trace_message(this,(string *)local_1d0,(string *)local_1f0);
        std::__cxx11::string::~string((string *)local_1f0);
        std::__cxx11::string::~string(local_1d0);
        std::__cxx11::string::~string((string *)local_190);
      }
      return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    local_1f4 = (*sysmanGlobalInitStored->pfnInit)(flags);
    if (driver->initSysManStatus != ZE_RESULT_SUCCESS) {
      local_1f4 = driver->initSysManStatus;
    }
    if ((this->debugTraceEnabled & 1U) != 0) {
      std::operator+((char *)local_278,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "init driver ");
      std::operator+(local_258,(char *)local_278);
      to_string_abi_cxx11_(local_298,flags);
      std::operator+(local_238,local_258);
      std::operator+(local_218,(char *)local_238);
      std::__cxx11::string::~string((string *)local_238);
      std::__cxx11::string::~string((string *)local_298);
      std::__cxx11::string::~string((string *)local_258);
      std::__cxx11::string::~string(local_278);
      std::__cxx11::string::string(local_2b8,(string *)local_218);
      to_string_abi_cxx11_((loader *)&pfnInit,local_1f4);
      debug_trace_message(this,(string *)local_2b8,(string *)&pfnInit);
      std::__cxx11::string::~string((string *)&pfnInit);
      std::__cxx11::string::~string(local_2b8);
      std::__cxx11::string::~string((string *)local_218);
    }
    return local_1f4;
  }
  if (desc == (ze_init_driver_type_desc_t *)0x0) {
    if (((driver->dditable).ze.Global.pfnInit == (ze_pfnInit_t)0x0) ||
       (globalInitStored->pfnInit == (ze_pfnInit_t)0x0)) {
      if ((this->debugTraceEnabled & 1U) != 0) {
        std::operator+((char *)local_320,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "init driver ");
        std::operator+(local_300,(char *)local_320);
        std::__cxx11::string::~string(local_320);
        std::__cxx11::string::string(local_340,(string *)local_300);
        to_string_abi_cxx11_(local_360,ZE_RESULT_ERROR_UNINITIALIZED);
        debug_trace_message(this,(string *)local_340,(string *)local_360);
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::string::~string(local_340);
        std::__cxx11::string::~string((string *)local_300);
      }
      return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    local_364 = (*globalInitStored->pfnInit)(flags);
    if ((local_364 != ZE_RESULT_SUCCESS) || (driver->initStatus != ZE_RESULT_SUCCESS)) {
      if (driver->initStatus != ZE_RESULT_SUCCESS) {
        local_364 = driver->initStatus;
      }
      if ((this->debugTraceEnabled & 1U) != 0) {
        std::operator+((char *)local_3e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "init driver (global ddi) ");
        std::operator+(local_3c8,(char *)local_3e8);
        to_string_abi_cxx11_(local_408,flags);
        std::operator+(local_3a8,local_3c8);
        std::operator+(local_388,(char *)local_3a8);
        std::__cxx11::string::~string((string *)local_3a8);
        std::__cxx11::string::~string((string *)local_408);
        std::__cxx11::string::~string((string *)local_3c8);
        std::__cxx11::string::~string(local_3e8);
        std::__cxx11::string::string(local_428,(string *)local_388);
        to_string_abi_cxx11_((loader *)&pfnInitDrivers,local_364);
        debug_trace_message(this,(string *)local_428,(string *)&pfnInitDrivers);
        std::__cxx11::string::~string((string *)&pfnInitDrivers);
        std::__cxx11::string::~string(local_428);
        std::__cxx11::string::~string((string *)local_388);
      }
      return local_364;
    }
  }
  else {
    if (((driver->dditable).ze.Global.pfnInitDrivers == (ze_pfnInitDrivers_t)0x0) ||
       (globalInitStored->pfnInitDrivers == (ze_pfnInitDrivers_t)0x0)) {
      if ((this->debugTraceEnabled & 1U) != 0) {
        std::operator+((char *)local_490,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "init driver ");
        std::operator+(local_470,(char *)local_490);
        std::__cxx11::string::~string(local_490);
        std::__cxx11::string::string(local_4b0,(string *)local_470);
        to_string_abi_cxx11_((loader *)&res_2,ZE_RESULT_ERROR_UNINITIALIZED);
        debug_trace_message(this,(string *)local_4b0,(string *)&res_2);
        std::__cxx11::string::~string((string *)&res_2);
        std::__cxx11::string::~string(local_4b0);
        std::__cxx11::string::~string((string *)local_470);
      }
      return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    local_4d4 = 0;
    local_4d8 = (*globalInitStored->pfnInitDrivers)(&local_4d4,(ze_driver_handle_t *)0x0,desc);
    if ((local_4d8 != ZE_RESULT_SUCCESS) || (driver->initDriversStatus != ZE_RESULT_SUCCESS)) {
      if (driver->initDriversStatus != ZE_RESULT_SUCCESS) {
        local_4d8 = driver->initDriversStatus;
      }
      if ((this->debugTraceEnabled & 1U) != 0) {
        std::operator+((char *)local_558,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "init driver (global ddi) ");
        std::operator+(local_538,(char *)local_558);
        to_string_abi_cxx11_(local_578,desc);
        std::operator+(local_518,local_538);
        std::operator+(local_4f8,(char *)local_518);
        std::__cxx11::string::~string((string *)local_518);
        std::__cxx11::string::~string((string *)local_578);
        std::__cxx11::string::~string((string *)local_538);
        std::__cxx11::string::~string(local_558);
        std::__cxx11::string::string(local_598,(string *)local_4f8);
        to_string_abi_cxx11_(local_5b8,local_4d8);
        debug_trace_message(this,(string *)local_598,(string *)local_5b8);
        std::__cxx11::string::~string((string *)local_5b8);
        std::__cxx11::string::~string(local_598);
        std::__cxx11::string::~string((string *)local_4f8);
      }
      return local_4d8;
    }
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

ze_result_t context_t::init_driver(driver_t &driver, ze_init_flags_t flags, ze_init_driver_type_desc_t* desc, ze_global_dditable_t *globalInitStored, zes_global_dditable_t *sysmanGlobalInitStored, bool sysmanOnly) {
        if (sysmanOnly) {
            auto getTable = reinterpret_cast<zes_pfnGetGlobalProcAddrTable_t>(
                GET_FUNCTION_PTR(driver.handle, "zesGetGlobalProcAddrTable"));
            if(!getTable) {
                if (debugTraceEnabled) {
                    std::string errorMessage = "init driver " + driver.name + " failed, zesGetGlobalProcAddrTable function pointer null. Returning ";
                    debug_trace_message(errorMessage, loader::to_string(ZE_RESULT_ERROR_UNINITIALIZED));
                }
                return ZE_RESULT_ERROR_UNINITIALIZED;
            }

            zes_global_dditable_t global;
            auto getTableResult = getTable(ZE_API_VERSION_CURRENT, &global);
            if(getTableResult != ZE_RESULT_SUCCESS) {
                if (debugTraceEnabled) {
                    std::string errorMessage = "init driver " + driver.name + " failed, zesGetGlobalProcAddrTable() failed with ";
                    debug_trace_message(errorMessage, loader::to_string(getTableResult));
                }
                return ZE_RESULT_ERROR_UNINITIALIZED;
            }

            if(nullptr == global.pfnInit) {
                if (debugTraceEnabled) {
                    std::string errorMessage = "init driver " + driver.name + " failed, zesInit function pointer null. Returning ";
                    debug_trace_message(errorMessage, loader::to_string(ZE_RESULT_ERROR_UNINITIALIZED));
                }
                return ZE_RESULT_ERROR_UNINITIALIZED;
            }

            // Use the previously init ddi table pointer to zesInit to allow for intercept of the zesInit calls
            ze_result_t res = sysmanGlobalInitStored->pfnInit(flags);
            // Verify that this driver successfully init in the call above.
            if (driver.initSysManStatus != ZE_RESULT_SUCCESS) {
                res = driver.initSysManStatus;
            }
            if (debugTraceEnabled) {
                std::string message = "init driver " + driver.name + " zesInit(" + loader::to_string(flags) + ") returning ";
                debug_trace_message(message, loader::to_string(res));
            }
            return res;
        } else {
            if (!desc) {
                auto pfnInit = driver.dditable.ze.Global.pfnInit;
                if(nullptr == pfnInit || globalInitStored->pfnInit == nullptr) {
                    if (debugTraceEnabled) {
                        std::string errorMessage = "init driver " + driver.name + " failed, zeInit function pointer null. Returning ";
                        debug_trace_message(errorMessage, loader::to_string(ZE_RESULT_ERROR_UNINITIALIZED));
                    }
                    return ZE_RESULT_ERROR_UNINITIALIZED;
                }

                // Use the previously init ddi table pointer to zeInit to allow for intercept of the zeInit calls
                ze_result_t res = globalInitStored->pfnInit(flags);
                // Verify that this driver successfully init in the call above.
                if (res != ZE_RESULT_SUCCESS || driver.initStatus != ZE_RESULT_SUCCESS) {
                    if (driver.initStatus != ZE_RESULT_SUCCESS)
                        res = driver.initStatus;
                    if (debugTraceEnabled) {
                        std::string message = "init driver (global ddi) " + driver.name + " zeInit(" + loader::to_string(flags) + ") returning ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    return res;
                }
            } else {
                auto pfnInitDrivers = driver.dditable.ze.Global.pfnInitDrivers;
                if(nullptr == pfnInitDrivers || globalInitStored->pfnInitDrivers == nullptr) {
                    if (debugTraceEnabled) {
                        std::string errorMessage = "init driver " + driver.name + " failed, pfnInitDrivers function pointer null. Returning ";
                        debug_trace_message(errorMessage, loader::to_string(ZE_RESULT_ERROR_UNINITIALIZED));
                    }
                    return ZE_RESULT_ERROR_UNINITIALIZED;
                }

                uint32_t pCount = 0;
                // Use the previously init ddi table pointer to zeInitDrivers to allow for intercept of the zeInitDrivers calls
                ze_result_t res = globalInitStored->pfnInitDrivers(&pCount, nullptr, desc);
                // Verify that this driver successfully init in the call above.
                if (res != ZE_RESULT_SUCCESS || driver.initDriversStatus != ZE_RESULT_SUCCESS) {
                    if (driver.initDriversStatus != ZE_RESULT_SUCCESS)
                        res = driver.initDriversStatus;
                    if (debugTraceEnabled) {
                        std::string message = "init driver (global ddi) " + driver.name + " zeInitDrivers(" + loader::to_string(desc) + ") returning ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    return res;
                }
            }
            return ZE_RESULT_SUCCESS;
        }
    }